

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proctitle.c
# Opt level: O0

int uv_set_process_title(char *title)

{
  size_t local_20;
  size_t len;
  uv__process_title *pt;
  char *title_local;
  
  local_20 = strlen(title);
  uv_once(&process_title_mutex_once,init_process_title_mutex_once);
  uv_mutex_lock(&process_title_mutex);
  if ((process_title.cap <= local_20) && (local_20 = 0, process_title.cap != 0)) {
    local_20 = process_title.cap - 1;
  }
  memcpy(process_title.str,title,local_20);
  memset(process_title.str + local_20,0,process_title.cap - local_20);
  process_title.len = local_20;
  uv_mutex_unlock(&process_title_mutex);
  return 0;
}

Assistant:

int uv_set_process_title(const char* title) {
  struct uv__process_title* pt;
  size_t len;

  pt = &process_title;
  len = strlen(title);

  uv_once(&process_title_mutex_once, init_process_title_mutex_once);
  uv_mutex_lock(&process_title_mutex);

  if (len >= pt->cap) {
    len = 0;
    if (pt->cap > 0)
      len = pt->cap - 1;
  }

  memcpy(pt->str, title, len);
  memset(pt->str + len, '\0', pt->cap - len);
  pt->len = len;

  uv_mutex_unlock(&process_title_mutex);

  return 0;
}